

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Image>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  ulong __n;
  TestContext *pTVar1;
  TestLog *this;
  MessageBuilder *pMVar2;
  Unique<vk::Handle<(vk::HandleType)9>_> *this_00;
  reference this_01;
  allocator<char> local_299;
  string local_298;
  undefined1 local_271;
  Move<vk::Handle<(vk::HandleType)9>_> local_270;
  RefData<vk::Handle<(vk::HandleType)9>_> local_250;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_> local_230;
  uint local_21c;
  char *pcStack_218;
  deUint32 ndx;
  MessageBuilder local_210;
  undefined4 local_90;
  deUint32 watchdogInterval;
  allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_> local_79;
  undefined1 local_78 [8];
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  objects;
  undefined1 local_58 [7];
  Resources res;
  Environment env;
  deUint32 numObjects;
  Context *context_local;
  
  env._52_4_ = Image::getMaxConcurrent(context,&params);
  Environment::Environment((Environment *)local_58,context,env._52_4_);
  Image::Resources::Resources
            ((Resources *)
             ((long)&objects.
                     super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),(Environment *)local_58
             ,&params);
  __n = (ulong)(uint)env._52_4_;
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>::allocator
            (&local_79);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
            *)local_78,__n,&local_79);
  std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>::
  ~allocator(&local_79);
  local_90 = 0x400;
  pTVar1 = Context::getTestContext(context);
  this = tcu::TestContext::getLog(pTVar1);
  tcu::TestLog::operator<<(&local_210,this,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [10])"Creating ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(uint *)&env.field_0x34);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x13b8ff9);
  pcStack_218 = ::vk::getTypeName<vk::Handle<(vk::HandleType)9>>();
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&stack0xfffffffffffffde8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [9])0x13837bb);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_210);
  for (local_21c = 0; local_21c < (uint)env._52_4_; local_21c = local_21c + 1) {
    this_00 = (Unique<vk::Handle<(vk::HandleType)9>_> *)operator_new(0x20);
    local_271 = 1;
    Image::create(&local_270,(Environment *)local_58,
                  (Resources *)
                  ((long)&objects.
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),&params);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_250,(Move *)&local_270);
    data.deleter.m_deviceIface = local_250.deleter.m_deviceIface;
    data.object.m_internal = local_250.object.m_internal;
    data.deleter.m_device = local_250.deleter.m_device;
    data.deleter.m_allocator = local_250.deleter.m_allocator;
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique(this_00,data);
    local_271 = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::SharedPtr
              (&local_230,this_00);
    this_01 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                            *)local_78,(ulong)local_21c);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::operator=
              (this_01,&local_230);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>::~SharedPtr(&local_230);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_270);
    if ((local_21c != 0) && ((local_21c & 0x3ff) == 0)) {
      pTVar1 = Context::getTestContext(context);
      tcu::TestContext::touchWatchdog(pTVar1);
    }
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::clear((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
           *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"Ok",&local_299);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
             *)local_78);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}